

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

void __thiscall
glslang::TDefaultGlslIoResolver::TDefaultGlslIoResolver
          (TDefaultGlslIoResolver *this,TIntermediate *intermediate)

{
  _Rb_tree_header *p_Var1;
  
  TDefaultIoResolverBase::TDefaultIoResolverBase(&this->super_TDefaultIoResolverBase,intermediate);
  (this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver =
       (_func_int **)&PTR__TDefaultGlslIoResolver_0089f3d0;
  this->preStage = EShLangCount;
  this->currentStage = EShLangCount;
  p_Var1 = &(this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->resourceSlotMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->storageSlotMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TDefaultGlslIoResolver::TDefaultGlslIoResolver(const TIntermediate& intermediate)
    : TDefaultIoResolverBase(intermediate)
    , preStage(EShLangCount)
    , currentStage(EShLangCount)
{ }